

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Money.cpp
# Opt level: O2

string * __thiscall Money::getCurrency_abi_cxx11_(string *__return_storage_ptr__,Money *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_currency);
  return __return_storage_ptr__;
}

Assistant:

std::string Money::getCurrency() const
{
    return m_currency;
}